

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O1

void JsrtDebugUtils::AddPropertyType
               (DynamicObject *object,IDiagObjectModelDisplay *objectDisplayRef,
               ScriptContext *scriptContext,bool forceSetValueProp)

{
  code *pcVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  BOOL BVar7;
  charcount_t cVar8;
  uint uVar9;
  undefined4 *puVar10;
  uint extraout_var;
  undefined4 extraout_var_00;
  RecyclableObject *pRVar11;
  undefined4 extraout_var_01;
  JavascriptString *pJVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar13;
  char16 *pcVar14;
  undefined4 extraout_var_04;
  JavascriptTypedNumber<unsigned_long> *pJVar15;
  JavascriptBoolean *pJVar16;
  JavascriptTypedNumber<long> *pJVar17;
  char *message;
  uint lineNumber;
  Type *this;
  JsrtDebugPropertyId propertyId;
  Type typeId;
  uint32 uVar18;
  uint32 value;
  Var aValue;
  
  if (objectDisplayRef == (IDiagObjectModelDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,0x8e,"(objectDisplayRef != nullptr)","objectDisplayRef != nullptr");
    if (!bVar4) goto LAB_003a596d;
    *puVar10 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,0x8f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar4) goto LAB_003a596d;
    *puVar10 = 0;
  }
  iVar5 = (*objectDisplayRef->_vptr_IDiagObjectModelDisplay[9])(objectDisplayRef,0);
  aValue = (Var)CONCAT44(extraout_var,iVar5);
  iVar6 = (*objectDisplayRef->_vptr_IDiagObjectModelDisplay[10])(objectDisplayRef);
  if (aValue == (Var)0x0) {
    iVar5 = (*objectDisplayRef->_vptr_IDiagObjectModelDisplay[3])(objectDisplayRef);
    this = &((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache;
    if (iVar5 == 0) {
      pJVar12 = Js::StringCache::GetStringTypeDisplay(this);
      iVar5 = (*(pJVar12->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar12);
      cVar8 = Js::JavascriptString::GetLength(pJVar12);
      AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,(char16 *)CONCAT44(extraout_var_04,iVar5)
                          ,(ulong)cVar8,scriptContext);
      bVar3 = 1;
      bVar4 = false;
      goto LAB_003a54a1;
    }
    pJVar12 = Js::StringCache::GetObjectTypeDisplay(this);
    iVar5 = (*(pJVar12->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar12);
    cVar8 = Js::JavascriptString::GetLength(pJVar12);
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,(char16 *)CONCAT44(extraout_var_02,iVar5),
                        (ulong)cVar8,scriptContext);
    pcVar14 = L"Object";
LAB_003a547d:
    sVar13 = PAL_wcslen(pcVar14);
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x2,pcVar14,sVar13,scriptContext);
    goto LAB_003a5498;
  }
  if ((extraout_var & 0x1ffff) != 0x10000 && (extraout_var & 0xffff0000) == 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_003a596d;
    *puVar10 = 0;
  }
  typeId = TypeIds_FirstNumberType;
  if (((extraout_var & 0xffff0000) != 0x10000) &&
     (typeId = TypeIds_Number, extraout_var >> 0x12 == 0)) {
    pRVar11 = Js::UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar11 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_003a596d;
      *puVar10 = 0;
    }
    typeId = ((pRVar11->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar7 = Js::RecyclableObject::IsExternal(pRVar11), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_003a596d;
      *puVar10 = 0;
    }
  }
  switch(typeId) {
  case TypeIds_Undefined:
    pJVar12 = Js::StringCache::GetUndefinedDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
    pRVar11 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
    goto LAB_003a57d5;
  case TypeIds_Null:
    pJVar12 = Js::StringCache::GetObjectTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
    pRVar11 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).nullValue.ptr;
LAB_003a57d5:
    pcVar14 = GetDebugPropertyName((JsrtDebugPropertyId)0x23);
    AddVarPropertyToObject(object,pcVar14,pRVar11,scriptContext);
    goto LAB_003a5498;
  case TypeIds_Boolean:
    pJVar12 = Js::StringCache::GetBooleanTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
    pJVar16 = Js::VarTo<Js::JavascriptBoolean>(aValue);
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x23,pJVar16->value == 1,scriptContext);
    break;
  case TypeIds_FirstNumberType:
    pJVar12 = Js::StringCache::GetNumberTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
    dVar2 = (double)iVar5;
    goto LAB_003a58f4;
  case TypeIds_Number:
    pJVar12 = Js::StringCache::GetNumberTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
    dVar2 = Js::JavascriptNumber::GetValue(aValue);
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x23,dVar2,scriptContext);
    bVar4 = Js::NumberUtilities::IsFinite(dVar2);
    if ((!bVar4) || (bVar4 = Js::NumberUtilities::IsSpecial(dVar2,0x8000000000000000), bVar4)) {
      bVar4 = true;
      bVar3 = 0;
      goto LAB_003a54a1;
    }
    break;
  case TypeIds_Int64Number:
    pJVar12 = Js::StringCache::GetNumberTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
    pJVar17 = Js::VarTo<Js::JavascriptTypedNumber<long>>(aValue);
    dVar2 = (double)pJVar17->m_value;
    goto LAB_003a58f4;
  case TypeIds_LastNumberType:
    pJVar12 = Js::StringCache::GetNumberTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
    pJVar15 = Js::VarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    dVar2 = ((double)CONCAT44(0x43300000,(int)pJVar15->m_value) - 4503599627370496.0) +
            ((double)CONCAT44(0x45300000,(int)(pJVar15->m_value >> 0x20)) - 1.9342813113834067e+25);
LAB_003a58f4:
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x23,dVar2,scriptContext);
    break;
  case TypeIds_String:
    pJVar12 = Js::StringCache::GetStringTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
    pJVar12 = Js::VarTo<Js::JavascriptString>(aValue);
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x23,pJVar12,scriptContext);
    break;
  case TypeIds_Symbol:
    pJVar12 = Js::StringCache::GetSymbolTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    goto LAB_003a56d3;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    message = "Unhandled type";
    lineNumber = 300;
    goto LAB_003a594f;
  case TypeIds_Enumerator:
  case TypeIds_HostDispatch:
  case TypeIds_UnscopablesWrapperObject:
  case TypeIds_LastStaticType:
  case TypeIds_EngineInterfaceObject:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    message = "Not valid types";
    lineNumber = 0xe5;
    goto LAB_003a594f;
  case TypeIds_Proxy:
  case TypeIds_Object:
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_CopyOnAccessNativeIntArray:
  case TypeIds_ArrayLast:
  case TypeIds_ArrayLastWithES5:
  case TypeIds_Date:
  case TypeIds_RegEx:
  case TypeIds_Error:
  case TypeIds_BooleanObject:
  case TypeIds_NumberObject:
  case TypeIds_StringObject:
  case TypeIds_Arguments:
  case TypeIds_ArrayBuffer:
  case TypeIds_Int8Array:
  case TypeIds_Uint8Array:
  case TypeIds_Uint8ClampedArray:
  case TypeIds_Int16Array:
  case TypeIds_Uint16Array:
  case TypeIds_Int32Array:
  case TypeIds_Uint32Array:
  case TypeIds_Float32Array:
  case TypeIds_Float64Array:
  case TypeIds_Int64Array:
  case TypeIds_Uint64Array:
  case TypeIds_CharArray:
  case TypeIds_BoolArray:
  case TypeIds_DataView:
  case TypeIds_Map:
  case TypeIds_Set:
  case TypeIds_WeakMap:
  case TypeIds_WeakSet:
  case TypeIds_SymbolObject:
  case TypeIds_ArrayIterator:
  case TypeIds_MapIterator:
  case TypeIds_SetIterator:
  case TypeIds_StringIterator:
  case TypeIds_Generator:
  case TypeIds_AsyncGenerator:
  case TypeIds_AsyncFromSyncIterator:
  case TypeIds_Promise:
  case TypeIds_WebAssemblyModule:
  case TypeIds_WebAssemblyInstance:
  case TypeIds_WebAssemblyMemory:
  case TypeIds_LastBuiltinDynamicObject:
  case TypeIds_GlobalObject:
  case TypeIds_SpreadArgument:
    pJVar12 = Js::StringCache::GetObjectTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    iVar5 = (*(pJVar12->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar12);
    cVar8 = Js::JavascriptString::GetLength(pJVar12);
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,(char16 *)CONCAT44(extraout_var_01,iVar5),
                        (ulong)cVar8,scriptContext);
    pcVar14 = GetClassName(typeId);
    goto LAB_003a547d;
  case TypeIds_Function:
    pJVar12 = Js::StringCache::GetFunctionTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    goto LAB_003a56d3;
  case TypeIds_LastTrueJavascriptObjectType:
  case TypeIds_HostObject:
  case TypeIds_ActivationObject:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    message = "Are these valid types for debugger?";
    lineNumber = 0xeb;
LAB_003a594f:
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,lineNumber,"(false)",message);
    if (!bVar4) {
LAB_003a596d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar10 = 0;
    bVar3 = 0;
    bVar4 = false;
    goto LAB_003a54a1;
  case TypeIds_ModuleNamespace:
    pJVar12 = Js::StringCache::GetModuleTypeDisplay
                        (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
LAB_003a56d3:
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x21,pJVar12,scriptContext);
LAB_003a5498:
    bVar4 = true;
    bVar3 = 0;
    goto LAB_003a54a1;
  }
  bVar3 = 0;
  bVar4 = false;
LAB_003a54a1:
  if ((bool)(bVar3 | bVar4)) {
    iVar5 = (*objectDisplayRef->_vptr_IDiagObjectModelDisplay[2])(objectDisplayRef,10);
    propertyId._value = 0x23;
    if (bVar4) {
      propertyId._value = 5;
    }
    sVar13 = PAL_wcslen((char16_t *)CONCAT44(extraout_var_03,iVar5));
    AddPropertyToObject(object,propertyId,(char16_t *)CONCAT44(extraout_var_03,iVar5),sVar13,
                        scriptContext);
  }
  if ((forceSetValueProp && aValue != (Var)0x0) &&
     (bVar4 = HasProperty(object,(JsrtDebugPropertyId)0x23,scriptContext), !bVar4)) {
    pcVar14 = GetDebugPropertyName((JsrtDebugPropertyId)0x23);
    AddVarPropertyToObject(object,pcVar14,aValue,scriptContext);
  }
  uVar9 = (*objectDisplayRef->_vptr_IDiagObjectModelDisplay[5])(objectDisplayRef);
  iVar5 = (*objectDisplayRef->_vptr_IDiagObjectModelDisplay[3])(objectDisplayRef);
  iVar5 = (uVar9 >> 9 & 4) + (uint)(iVar5 != 0) * 2;
  uVar18 = iVar5 + 1;
  value = uVar18;
  if ((long *)CONCAT44(extraout_var_00,iVar6) != (long *)0x0) {
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x18))();
    value = iVar5 + 9;
    if (iVar6 == 0) {
      value = uVar18;
    }
  }
  AddPropertyToObject(object,(JsrtDebugPropertyId)0x16,value,scriptContext);
  return;
}

Assistant:

void JsrtDebugUtils::AddPropertyType(Js::DynamicObject * object, Js::IDiagObjectModelDisplay* objectDisplayRef, Js::ScriptContext * scriptContext, bool forceSetValueProp)
{
    Assert(objectDisplayRef != nullptr);
    Assert(scriptContext != nullptr);

    bool addDisplay = false;
    bool addValue = false;

    Js::Var varValue = objectDisplayRef->GetVarValue(FALSE);
    Js::IDiagObjectAddress* varAddress = objectDisplayRef->GetDiagAddress();

    if (varValue != nullptr)
    {
        Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(varValue);

        switch (typeId)
        {
        case Js::TypeIds_Undefined:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetUndefinedDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, scriptContext->GetLibrary()->GetUndefined(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_Null:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetObjectTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, scriptContext->GetLibrary()->GetNull(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_Boolean:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetBooleanTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, Js::VarTo<Js::JavascriptBoolean>(varValue)->GetValue() == TRUE ? true : false, scriptContext);
            break;

        case Js::TypeIds_Integer:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetNumberTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, Js::TaggedInt::ToDouble(varValue), scriptContext);
            break;

        case Js::TypeIds_Number:
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetNumberTypeDisplayString(), scriptContext);

            double numberValue = Js::JavascriptNumber::GetValue(varValue);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, numberValue, scriptContext);

            // If number is not finite (NaN, Infinity, -Infinity) or is -0 add display as well so that we can display special strings
            if (!Js::NumberUtilities::IsFinite(numberValue) || Js::JavascriptNumber::IsNegZero(numberValue))
            {
                addDisplay = true;
            }

            break;
        }
        case Js::TypeIds_Int64Number:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetNumberTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, (double)Js::VarTo<Js::JavascriptInt64Number>(varValue)->GetValue(), scriptContext);
            break;

        case Js::TypeIds_UInt64Number:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetNumberTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, (double)Js::VarTo<Js::JavascriptUInt64Number>(varValue)->GetValue(), scriptContext);
            break;

        case Js::TypeIds_String:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetStringTypeDisplayString(), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, Js::VarTo<Js::JavascriptString>(varValue), scriptContext);
            break;

        case Js::TypeIds_Symbol:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetSymbolTypeDisplayString(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_Function:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetFunctionTypeDisplayString(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_ModuleNamespace:
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetModuleTypeDisplayString(), scriptContext);
            addDisplay = true;
            break;

        case Js::TypeIds_Enumerator:
        case Js::TypeIds_HostDispatch:
        case Js::TypeIds_UnscopablesWrapperObject:
        case Js::TypeIds_UndeclBlockVar:
        case Js::TypeIds_EngineInterfaceObject:
            AssertMsg(false, "Not valid types");
            break;

        case Js::TypeIds_ModuleRoot:
        case Js::TypeIds_HostObject:
        case Js::TypeIds_ActivationObject:
            AssertMsg(false, "Are these valid types for debugger?");
            break;

        case Js::TypeIds_NativeIntArray:
#if ENABLE_COPYONACCESS_ARRAY
        case Js::TypeIds_CopyOnAccessNativeIntArray:
#endif
        case Js::TypeIds_NativeFloatArray:
        case Js::TypeIds_ES5Array:
        case Js::TypeIds_CharArray:
        case Js::TypeIds_BoolArray:
        case Js::TypeIds_ArrayIterator:
        case Js::TypeIds_MapIterator:
        case Js::TypeIds_SetIterator:
        case Js::TypeIds_StringIterator:
        case Js::TypeIds_Object:
        case Js::TypeIds_Array:
        case Js::TypeIds_Date:
        case Js::TypeIds_RegEx:
        case Js::TypeIds_Error:
        case Js::TypeIds_BooleanObject:
        case Js::TypeIds_NumberObject:
        case Js::TypeIds_StringObject:
        case Js::TypeIds_Arguments:
        case Js::TypeIds_ArrayBuffer:
        case Js::TypeIds_Int8Array:
        case Js::TypeIds_Uint8Array:
        case Js::TypeIds_Uint8ClampedArray:
        case Js::TypeIds_Int16Array:
        case Js::TypeIds_Uint16Array:
        case Js::TypeIds_Int32Array:
        case Js::TypeIds_Uint32Array:
        case Js::TypeIds_Float32Array:
        case Js::TypeIds_Float64Array:
        case Js::TypeIds_Int64Array:
        case Js::TypeIds_Uint64Array:
        case Js::TypeIds_DataView:
        case Js::TypeIds_Map:
        case Js::TypeIds_Set:
        case Js::TypeIds_WeakMap:
        case Js::TypeIds_WeakSet:
        case Js::TypeIds_SymbolObject:
        case Js::TypeIds_Generator:
        case Js::TypeIds_AsyncGenerator:
        case Js::TypeIds_AsyncFromSyncIterator:
        case Js::TypeIds_Promise:
        case Js::TypeIds_GlobalObject:
        case Js::TypeIds_SpreadArgument:
#ifdef ENABLE_WASM
        case Js::TypeIds_WebAssemblyModule:
        case Js::TypeIds_WebAssemblyInstance:
        case Js::TypeIds_WebAssemblyMemory:
        case Js::TypeIds_WebAssemblyTable:
#endif

        case Js::TypeIds_Proxy:
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetObjectTypeDisplayString(), scriptContext);
            addDisplay = true;
            const char16* className = JsrtDebugUtils::GetClassName(typeId);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::className, className, wcslen(className), scriptContext);
            break;
        }

        default:
            AssertMsg(false, "Unhandled type");
            break;
        }
    }
    else
    {
        if (objectDisplayRef->HasChildren())
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetObjectTypeDisplayString(), scriptContext);
            addDisplay = true;
            const char16* className = JsrtDebugUtils::GetClassName(Js::TypeIds_Object);
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::className, className, wcslen(className), scriptContext);
        }
        else
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetStringTypeDisplayString(), scriptContext);
            addValue = true;
        }
    }

    if (addDisplay || addValue)
    {
        LPCWSTR value = nullptr;

        // Getting value might call getter which can throw so wrap in try catch
        try
        {
            value = objectDisplayRef->Value(10);
        }
        catch (const Js::JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            value = _u("");
        }

        JsrtDebugUtils::AddPropertyToObject(object, addDisplay ? JsrtDebugPropertyId::display : JsrtDebugPropertyId::value, value, wcslen(value), scriptContext);
    }

    if (forceSetValueProp && varValue != nullptr && !JsrtDebugUtils::HasProperty(object, JsrtDebugPropertyId::value, scriptContext))
    {
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::value, varValue, scriptContext);
    }

    DBGPROP_ATTRIB_FLAGS dbPropAttrib = objectDisplayRef->GetTypeAttribute();

    JsrtDebugPropertyAttribute propertyAttributes = JsrtDebugPropertyAttribute::NONE;

    if ((dbPropAttrib & DBGPROP_ATTRIB_VALUE_READONLY) == DBGPROP_ATTRIB_VALUE_READONLY)
    {
        propertyAttributes |= JsrtDebugPropertyAttribute::READ_ONLY_VALUE;
    }

    if (objectDisplayRef->HasChildren())
    {
        propertyAttributes |= JsrtDebugPropertyAttribute::HAVE_CHILDRENS;
    }

    if (varAddress != nullptr && varAddress->IsInDeadZone())
    {
        propertyAttributes |= JsrtDebugPropertyAttribute::IN_TDZ;
    }

    JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::propertyAttributes, (UINT)propertyAttributes, scriptContext);
}